

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readToken(OurReader *this,Token *token)

{
  char *pcVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  byte *pbVar6;
  Location pCVar7;
  long lVar8;
  
  pbVar2 = (byte *)this->end_;
  pbVar6 = (byte *)this->current_;
  while (((pbVar6 != pbVar2 && ((ulong)*pbVar6 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    this->current_ = (Location)pbVar6;
  }
  pbVar6 = (byte *)this->current_;
  token->start_ = (Location)pbVar6;
  if (pbVar6 == pbVar2) {
    bVar5 = 0;
  }
  else {
    this->current_ = (Location)(pbVar6 + 1);
    bVar5 = *pbVar6;
  }
  if (0x5a < bVar5) {
    if (bVar5 < 0x6e) {
      if (bVar5 == 0x5b) {
        token->type_ = tokenArrayBegin;
        goto LAB_004bfc4c;
      }
      if (bVar5 == 0x5d) {
        token->type_ = tokenArrayEnd;
        goto LAB_004bfc4c;
      }
      if (bVar5 == 0x66) {
        token->type_ = tokenFalse;
        pCVar7 = this->current_;
        if (3 < (long)pbVar2 - (long)pCVar7) {
          lVar8 = 3;
          do {
            if (lVar8 == -1) {
              pCVar7 = pCVar7 + 4;
              goto LAB_004bfc71;
            }
            pcVar1 = pCVar7 + lVar8;
            lVar3 = lVar8 + 1;
            lVar8 = lVar8 + -1;
          } while (*pcVar1 == "False"[lVar3]);
        }
      }
    }
    else if (bVar5 < 0x7b) {
      if (bVar5 == 0x6e) {
        token->type_ = tokenNull;
        pCVar7 = this->current_;
        if (2 < (long)pbVar2 - (long)pCVar7) {
          lVar8 = 2;
          do {
            if (lVar8 == -1) goto LAB_004bfbf6;
            pcVar1 = pCVar7 + lVar8;
            lVar3 = lVar8 + 8;
            lVar8 = lVar8 + -1;
          } while (*pcVar1 == "--help-full"[lVar3]);
        }
      }
      else if (bVar5 == 0x74) {
        token->type_ = tokenTrue;
        pCVar7 = this->current_;
        if (2 < (long)pbVar2 - (long)pCVar7) {
          lVar8 = 2;
          do {
            if (lVar8 == -1) goto LAB_004bfbf6;
            pcVar1 = pCVar7 + lVar8;
            lVar3 = lVar8 + 1;
            lVar8 = lVar8 + -1;
          } while (*pcVar1 == "True"[lVar3]);
        }
      }
    }
    else {
      if (bVar5 == 0x7d) {
        token->type_ = tokenObjectEnd;
        goto LAB_004bfc4c;
      }
      if (bVar5 == 0x7b) {
        token->type_ = tokenObjectBegin;
        goto LAB_004bfc4c;
      }
    }
    goto switchD_004bf972_caseD_23;
  }
  switch(bVar5) {
  case 0x22:
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_004bfb6b;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
    break;
  case 0x27:
    if ((this->features_).allowSingleQuotes_ != true) goto switchD_004bf972_caseD_2f;
    token->type_ = tokenString;
    bVar4 = readStringSingleQuote(this);
    goto LAB_004bfb6b;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_004bfc4c;
  case 0x2d:
    bVar4 = readNumber(this,true);
    if (bVar4) {
      token->type_ = tokenNumber;
      goto LAB_004bfc4c;
    }
    token->type_ = tokenNegInf;
    if (((this->features_).allowSpecialFloats_ == true) &&
       (pCVar7 = this->current_, 6 < (long)this->end_ - (long)pCVar7)) {
      lVar8 = 6;
      do {
        if (lVar8 == -1) {
          this->current_ = pCVar7 + 7;
          goto LAB_004bfc4c;
        }
        pcVar1 = pCVar7 + lVar8;
        lVar3 = lVar8 + 2;
        lVar8 = lVar8 + -1;
      } while (*pcVar1 == "-Infinity"[lVar3]);
    }
    break;
  case 0x2f:
switchD_004bf972_caseD_2f:
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_004bfb6b:
    if (bVar4 != false) goto LAB_004bfc4c;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this,false);
    goto LAB_004bfc4c;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    goto LAB_004bfc4c;
  case 0x49:
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenPosInf;
      pCVar7 = this->current_;
      if (6 < (long)pbVar2 - (long)pCVar7) {
        lVar8 = 6;
        do {
          if (lVar8 == -1) {
            pCVar7 = pCVar7 + 7;
            goto LAB_004bfc71;
          }
          pcVar1 = pCVar7 + lVar8;
          lVar3 = lVar8 + 2;
          lVar8 = lVar8 + -1;
        } while (*pcVar1 == "-Infinity"[lVar3]);
      }
    }
    break;
  case 0x4e:
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenNaN;
      pCVar7 = this->current_;
      if (1 < (long)pbVar2 - (long)pCVar7) {
        lVar8 = 1;
        do {
          if (lVar8 == -1) {
            pCVar7 = pCVar7 + 2;
            goto LAB_004bfc71;
          }
          pcVar1 = pCVar7 + lVar8;
          lVar3 = lVar8 + 1;
          lVar8 = lVar8 + -1;
        } while (*pcVar1 == "NaN"[lVar3]);
      }
    }
    break;
  default:
    if (bVar5 == 0) {
      token->type_ = tokenEndOfStream;
      goto LAB_004bfc4c;
    }
  }
switchD_004bf972_caseD_23:
  token->type_ = tokenError;
LAB_004bfc4c:
  token->end_ = this->current_;
  return true;
LAB_004bfbf6:
  pCVar7 = pCVar7 + 3;
LAB_004bfc71:
  this->current_ = pCVar7;
  goto LAB_004bfc4c;
}

Assistant:

bool OurReader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '\'':
    if (features_.allowSingleQuotes_) {
    token.type_ = tokenString;
    ok = readStringSingleQuote();
    break;
    } // else continue
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token.type_ = tokenNumber;
    readNumber(false);
    break;
  case '-':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenNegInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case 'N':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenNaN;
      ok = match("aN", 2);
    } else {
      ok = false;
    }
    break;
  case 'I':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenPosInf;
      ok = match("nfinity", 7);
    } else {
      ok = false;
    }
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}